

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkDupDfs_rec(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  Wlc_Obj_t *pWVar1;
  uint uVar2;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *paVar3;
  ulong uVar4;
  long lVar5;
  
  if ((iObj < 0) || ((p->vCopies).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((p->vCopies).pArray[(uint)iObj] != 0) {
    return;
  }
  if ((iObj != 0) && (iObj < p->nObjsAlloc)) {
    uVar2 = p->pObjs[(uint)iObj].nFanins;
    uVar4 = (ulong)uVar2;
    if (0 < (int)uVar2) {
      pWVar1 = p->pObjs + (uint)iObj;
      lVar5 = 0;
      do {
        if ((2 < (uint)uVar4) ||
           (paVar3 = &pWVar1->field_8,
           (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x6)) {
          paVar3 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)(pWVar1->field_8).pFanins[0];
        }
        Wlc_NtkDupDfs_rec(pNew,p,paVar3->Fanins[lVar5],vFanins);
        lVar5 = lVar5 + 1;
        uVar4 = (ulong)(int)pWVar1->nFanins;
      } while (lVar5 < (long)uVar4);
    }
    Wlc_ObjDup(pNew,p,iObj,vFanins);
    return;
  }
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

void Wlc_NtkDupDfs_rec( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj;
    int i, iFanin;
    if ( Wlc_ObjCopy(p, iObj) )
        return;
    pObj = Wlc_NtkObj( p, iObj );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkDupDfs_rec( pNew, p, iFanin, vFanins );
    Wlc_ObjDup( pNew, p, iObj, vFanins );
}